

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

void google::protobuf::internal::SerializeMapKey
               (NodeBase *node,MapTypeCard type_card,CodedOutputStream *coded_output)

{
  bool bVar1;
  WireType WVar2;
  uint uVar3;
  CppType CVar4;
  int v1;
  int v2;
  unsigned_long uVar5;
  LogMessage *pLVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  undefined1 auVar7 [16];
  LogMessageFatal local_40 [23];
  Voidify local_29;
  string *local_28;
  string *absl_log_internal_check_op_result;
  CodedOutputStream *coded_output_local;
  NodeBase *node_local;
  MapTypeCard type_card_local;
  
  absl_log_internal_check_op_result = (string *)coded_output;
  coded_output_local = (CodedOutputStream *)node;
  node_local._7_1_ = type_card.data_;
  WVar2 = MapTypeCard::wiretype((MapTypeCard *)((long)&node_local + 7));
  switch(WVar2) {
  case WIRETYPE_VARINT:
    CVar4 = MapTypeCard::cpp_type((MapTypeCard *)((long)&node_local + 7));
    if (CVar4 == kBool) {
      bVar1 = KeyNode<bool>::key((KeyNode<bool> *)coded_output_local);
      WireFormatLite::WriteBool(1,bVar1,(CodedOutputStream *)absl_log_internal_check_op_result);
    }
    else if (CVar4 == k32) {
      bVar1 = MapTypeCard::is_zigzag((MapTypeCard *)((long)&node_local + 7));
      if (bVar1) {
        uVar3 = KeyNode<unsigned_int>::key((KeyNode<unsigned_int> *)coded_output_local);
        WireFormatLite::WriteSInt32(1,uVar3,(CodedOutputStream *)absl_log_internal_check_op_result);
      }
      else {
        bVar1 = MapTypeCard::is_signed((MapTypeCard *)((long)&node_local + 7));
        if (bVar1) {
          uVar3 = KeyNode<unsigned_int>::key((KeyNode<unsigned_int> *)coded_output_local);
          WireFormatLite::WriteInt32(1,uVar3,(CodedOutputStream *)absl_log_internal_check_op_result)
          ;
        }
        else {
          uVar3 = KeyNode<unsigned_int>::key((KeyNode<unsigned_int> *)coded_output_local);
          WireFormatLite::WriteUInt32
                    (1,uVar3,(CodedOutputStream *)absl_log_internal_check_op_result);
        }
      }
    }
    else {
      if (CVar4 != k64) {
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0x9a9);
      }
      bVar1 = MapTypeCard::is_zigzag((MapTypeCard *)((long)&node_local + 7));
      if (bVar1) {
        uVar5 = KeyNode<unsigned_long>::key((KeyNode<unsigned_long> *)coded_output_local);
        WireFormatLite::WriteSInt64(1,uVar5,(CodedOutputStream *)absl_log_internal_check_op_result);
      }
      else {
        bVar1 = MapTypeCard::is_signed((MapTypeCard *)((long)&node_local + 7));
        if (bVar1) {
          uVar5 = KeyNode<unsigned_long>::key((KeyNode<unsigned_long> *)coded_output_local);
          WireFormatLite::WriteInt64(1,uVar5,(CodedOutputStream *)absl_log_internal_check_op_result)
          ;
        }
        else {
          uVar5 = KeyNode<unsigned_long>::key((KeyNode<unsigned_long> *)coded_output_local);
          WireFormatLite::WriteUInt64
                    (1,uVar5,(CodedOutputStream *)absl_log_internal_check_op_result);
        }
      }
    }
    break;
  case WIRETYPE_FIXED64:
    uVar5 = KeyNode<unsigned_long>::key((KeyNode<unsigned_long> *)coded_output_local);
    WireFormatLite::WriteFixed64(1,uVar5,(CodedOutputStream *)absl_log_internal_check_op_result);
    break;
  case WIRETYPE_LENGTH_DELIMITED:
    CVar4 = MapTypeCard::cpp_type((MapTypeCard *)((long)&node_local + 7));
    v1 = absl::lts_20240722::log_internal::GetReferenceableValue(CVar4);
    v2 = absl::lts_20240722::log_internal::GetReferenceableValue(3);
    local_28 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                         (v1,v2,"+type_card.cpp_type() == +MapTypeCard::kString");
    if (local_28 != (string *)0x0) {
      auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_28);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x9b6,auVar7._0_8_,auVar7._8_8_);
      pLVar6 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_29,pLVar6);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
    }
    value = KeyNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::key((KeyNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)coded_output_local);
    WireFormatLite::WriteString(1,value,(CodedOutputStream *)absl_log_internal_check_op_result);
    break;
  default:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                ,0x9bc);
  case WIRETYPE_FIXED32:
    uVar3 = KeyNode<unsigned_int>::key((KeyNode<unsigned_int> *)coded_output_local);
    WireFormatLite::WriteFixed32(1,uVar3,(CodedOutputStream *)absl_log_internal_check_op_result);
  }
  return;
}

Assistant:

static void SerializeMapKey(const NodeBase* node, MapTypeCard type_card,
                            io::CodedOutputStream& coded_output) {
  switch (type_card.wiretype()) {
    case WireFormatLite::WIRETYPE_VARINT:
      switch (type_card.cpp_type()) {
        case MapTypeCard::kBool:
          WireFormatLite::WriteBool(
              1, static_cast<const KeyNode<bool>*>(node)->key(), &coded_output);
          break;
        case MapTypeCard::k32:
          if (type_card.is_zigzag()) {
            WireFormatLite::WriteSInt32(
                1, static_cast<const KeyNode<uint32_t>*>(node)->key(),
                &coded_output);
          } else if (type_card.is_signed()) {
            WireFormatLite::WriteInt32(
                1, static_cast<const KeyNode<uint32_t>*>(node)->key(),
                &coded_output);
          } else {
            WireFormatLite::WriteUInt32(
                1, static_cast<const KeyNode<uint32_t>*>(node)->key(),
                &coded_output);
          }
          break;
        case MapTypeCard::k64:
          if (type_card.is_zigzag()) {
            WireFormatLite::WriteSInt64(
                1, static_cast<const KeyNode<uint64_t>*>(node)->key(),
                &coded_output);
          } else if (type_card.is_signed()) {
            WireFormatLite::WriteInt64(
                1, static_cast<const KeyNode<uint64_t>*>(node)->key(),
                &coded_output);
          } else {
            WireFormatLite::WriteUInt64(
                1, static_cast<const KeyNode<uint64_t>*>(node)->key(),
                &coded_output);
          }
          break;
        default:
          Unreachable();
      }
      break;
    case WireFormatLite::WIRETYPE_FIXED32:
      WireFormatLite::WriteFixed32(
          1, static_cast<const KeyNode<uint32_t>*>(node)->key(), &coded_output);
      break;
    case WireFormatLite::WIRETYPE_FIXED64:
      WireFormatLite::WriteFixed64(
          1, static_cast<const KeyNode<uint64_t>*>(node)->key(), &coded_output);
      break;
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED:
      // We should never have a message here. They can only be values maps.
      ABSL_DCHECK_EQ(+type_card.cpp_type(), +MapTypeCard::kString);
      WireFormatLite::WriteString(
          1, static_cast<const KeyNode<std::string>*>(node)->key(),
          &coded_output);
      break;
    default:
      Unreachable();
  }
}